

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Parse(lemon *gp)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int lineno_00;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  char *z;
  size_t sVar6;
  ushort **ppuVar7;
  bool bVar8;
  bool local_3f6b;
  bool local_3f69;
  bool local_3f67;
  bool local_3f64;
  bool local_3f62;
  int prevc_1;
  int startchar;
  int prevc;
  int level;
  int startline;
  char *nextcp;
  char *cp;
  int local_3f30;
  int c;
  int lineno;
  int filesize;
  char *filebuf;
  FILE *fp;
  pstate ps;
  lemon *gp_local;
  
  ps.lastrule = (rule *)gp;
  memset(&fp,0,0x3f08);
  ps.tokenstart = (char *)ps.lastrule;
  fp = (FILE *)ps.lastrule[1].nextlhs;
  ps.filename._4_4_ = 0;
  ps.gp._0_4_ = 0;
  __stream = fopen((char *)fp,"rb");
  if (__stream == (FILE *)0x0) {
    ErrorMsg((char *)fp,0,"Can\'t open this file for reading.");
    *(int *)&(ps.lastrule)->rhsalias = *(int *)&(ps.lastrule)->rhsalias + 1;
  }
  else {
    fseek(__stream,0,2);
    uVar5 = ftell(__stream);
    iVar4 = (int)uVar5;
    rewind(__stream);
    z = (char *)malloc((long)(iVar4 + 1));
    if (z == (char *)0x0) {
      ErrorMsg((char *)fp,0,"Can\'t allocate %d of memory to hold this file.",(ulong)(iVar4 + 1));
      *(int *)&(ps.lastrule)->rhsalias = *(int *)&(ps.lastrule)->rhsalias + 1;
    }
    else {
      sVar6 = fread(z,1,(long)iVar4,__stream);
      if (sVar6 == (long)iVar4) {
        fclose(__stream);
        z[iVar4] = '\0';
        preprocess_input(z);
        local_3f30 = 1;
        nextcp = z;
        while (iVar4 = (int)*nextcp, iVar4 != 0) {
          if (iVar4 == 10) {
            local_3f30 = local_3f30 + 1;
          }
          lineno_00 = local_3f30;
          ppuVar7 = __ctype_b_loc();
          if (((*ppuVar7)[iVar4] & 0x2000) == 0) {
            if ((iVar4 == 0x2f) && (nextcp[1] == '/')) {
              for (nextcp = nextcp + 2; *nextcp != '\0' && *nextcp != '\n'; nextcp = nextcp + 1) {
              }
            }
            else if ((iVar4 == 0x2f) && (nextcp[1] == '*')) {
              nextcp = nextcp + 2;
              while( true ) {
                cVar1 = *nextcp;
                bVar8 = false;
                if ((cVar1 != '\0') && (bVar8 = true, cVar1 == '/')) {
                  bVar8 = nextcp[-1] != '*';
                }
                if (!bVar8) break;
                if (cVar1 == '\n') {
                  local_3f30 = local_3f30 + 1;
                }
                nextcp = nextcp + 1;
              }
              if (cVar1 != '\0') {
                nextcp = nextcp + 1;
              }
            }
            else {
              ps._8_8_ = nextcp;
              ps.filename._0_4_ = local_3f30;
              _level = nextcp;
              if (iVar4 == 0x22) {
                while( true ) {
                  nextcp = _level + 1;
                  cVar1 = *nextcp;
                  if (cVar1 == '\0' || cVar1 == '\"') break;
                  _level = nextcp;
                  if (cVar1 == '\n') {
                    local_3f30 = local_3f30 + 1;
                  }
                }
                if (cVar1 == '\0') {
                  ErrorMsg((char *)fp,0,
                           "String starting on this line is not terminated before the end of the file."
                          );
                  ps.filename._4_4_ = ps.filename._4_4_ + 1;
                  _level = nextcp;
                }
                else {
                  _level = _level + 2;
                }
              }
              else if (iVar4 == 0x7b) {
                startchar = 1;
                while( true ) {
                  _level = nextcp;
                  nextcp = _level + 1;
                  cVar1 = *nextcp;
                  local_3f62 = false;
                  if (cVar1 != '\0') {
                    local_3f62 = 1 < startchar || cVar1 != '}';
                  }
                  if (!local_3f62) break;
                  if (cVar1 == '\n') {
                    local_3f30 = local_3f30 + 1;
                  }
                  else if (cVar1 == '{') {
                    startchar = startchar + 1;
                  }
                  else if (cVar1 == '}') {
                    startchar = startchar + -1;
                  }
                  else if ((cVar1 == '/') && (_level[2] == '*')) {
                    nextcp = _level + 3;
                    prevc_1 = 0;
                    while( true ) {
                      iVar4 = (int)*nextcp;
                      local_3f64 = false;
                      if (iVar4 != 0) {
                        local_3f64 = iVar4 != 0x2f || prevc_1 != 0x2a;
                      }
                      if (!local_3f64) break;
                      if (iVar4 == 10) {
                        local_3f30 = local_3f30 + 1;
                      }
                      nextcp = nextcp + 1;
                      prevc_1 = iVar4;
                    }
                  }
                  else if ((cVar1 == '/') && (_level[2] == '/')) {
                    for (nextcp = _level + 3; cVar1 = *nextcp, cVar1 != '\0' && cVar1 != '\n';
                        nextcp = nextcp + 1) {
                    }
                    if (cVar1 != '\0') {
                      local_3f30 = local_3f30 + 1;
                    }
                  }
                  else if ((cVar1 == '\'') || (cVar1 == '\"')) {
                    nextcp = _level + 2;
                    cVar3 = '\0';
                    while( true ) {
                      cVar2 = *nextcp;
                      local_3f67 = false;
                      if (cVar2 != '\0') {
                        local_3f67 = cVar2 != cVar1 || cVar3 == '\\';
                      }
                      if (!local_3f67) break;
                      if (cVar2 == '\n') {
                        local_3f30 = local_3f30 + 1;
                      }
                      if (cVar3 == '\\') {
                        cVar2 = '\0';
                      }
                      nextcp = nextcp + 1;
                      cVar3 = cVar2;
                    }
                  }
                }
                if (cVar1 == '\0') {
                  ErrorMsg((char *)fp,lineno_00,
                           "C code starting on this line is not terminated before the end of the file."
                          );
                  ps.filename._4_4_ = ps.filename._4_4_ + 1;
                  _level = nextcp;
                }
                else {
                  _level = _level + 2;
                }
              }
              else {
                ppuVar7 = __ctype_b_loc();
                if (((*ppuVar7)[iVar4] & 8) == 0) {
                  if (((iVar4 == 0x3a) && (nextcp[1] == ':')) && (nextcp[2] == '=')) {
                    _level = nextcp + 3;
                    nextcp = _level;
                  }
                  else if (((iVar4 == 0x2f) || (iVar4 == 0x7c)) &&
                          (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)nextcp[1]] & 0x400) != 0)) {
                    nextcp = nextcp + 2;
                    while( true ) {
                      iVar4 = (int)*nextcp;
                      local_3f6b = false;
                      if (iVar4 != 0) {
                        ppuVar7 = __ctype_b_loc();
                        local_3f6b = ((*ppuVar7)[iVar4] & 8) != 0 || iVar4 == 0x5f;
                      }
                      _level = nextcp;
                      if (!local_3f6b) break;
                      nextcp = nextcp + 1;
                    }
                  }
                  else {
                    _level = nextcp + 1;
                    nextcp = _level;
                  }
                }
                else {
                  while( true ) {
                    iVar4 = (int)*nextcp;
                    local_3f69 = false;
                    if (iVar4 != 0) {
                      ppuVar7 = __ctype_b_loc();
                      local_3f69 = ((*ppuVar7)[iVar4] & 8) != 0 || iVar4 == 0x5f;
                    }
                    _level = nextcp;
                    if (!local_3f69) break;
                    nextcp = nextcp + 1;
                  }
                }
              }
              cVar1 = *nextcp;
              *nextcp = '\0';
              parseonetoken((pstate *)&fp);
              *nextcp = cVar1;
              nextcp = _level;
            }
          }
          else {
            nextcp = nextcp + 1;
          }
        }
        free(z);
        (ps.lastrule)->lhsalias = (char *)ps._16112_8_;
        *(int *)&(ps.lastrule)->rhsalias = ps.filename._4_4_;
      }
      else {
        ErrorMsg((char *)fp,0,"Can\'t read in all %d bytes of this file.",uVar5 & 0xffffffff);
        free(z);
        *(int *)&(ps.lastrule)->rhsalias = *(int *)&(ps.lastrule)->rhsalias + 1;
      }
    }
  }
  return;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filebuf==0 ){
    ErrorMsg(ps.filename,0,"Can't allocate %d of memory to hold this file.",
      filesize+1);
    gp->errorcnt++;
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    return;
  }
  fclose(fp);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( isspace(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( isalnum(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && isalpha(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}